

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  undefined1 uVar6;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  AssertionInfo *in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined4 in_stack_fffffffffffffec0;
  OfType in_stack_fffffffffffffedc;
  AssertionResultData *in_stack_fffffffffffffee0;
  LazyExpression local_88;
  LazyExpression local_78 [3];
  AssertionResult *in_stack_ffffffffffffffb8;
  RunContext *in_stack_ffffffffffffffc0;
  
  *(undefined4 *)&in_RDI[7].macroName.m_size = *(undefined4 *)(in_RSI + 6);
  pcVar1 = (char *)*in_RSI;
  sVar2 = in_RSI[1];
  pcVar3 = (char *)in_RSI[2];
  sVar4 = in_RSI[3];
  pcVar5 = (char *)in_RSI[5];
  *(undefined8 *)&in_RDI[6].resultDisposition = in_RSI[4];
  in_RDI[7].macroName.m_start = pcVar5;
  in_RDI[6].capturedExpression.m_start = pcVar3;
  in_RDI[6].capturedExpression.m_size = sVar4;
  in_RDI[6].lineInfo.file = pcVar1;
  in_RDI[6].lineInfo.line = sVar2;
  LazyExpression::LazyExpression(&local_88,false);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,local_78);
  AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_EDX,in_stack_fffffffffffffec0),in_RDI,
             (AssertionResultData *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  assertionEnded(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar6 = AssertionResult::isOk
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  if (!(bool)uVar6) {
    populateReaction((RunContext *)CONCAT44(in_EDX,in_stack_fffffffffffffec0),
                     (AssertionReaction *)in_RDI);
  }
  AssertionResult::~AssertionResult((AssertionResult *)0x130e1c);
  AssertionResultData::~AssertionResultData
            ((AssertionResultData *)CONCAT17(uVar6,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }